

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

shared_ptr<Quest_Context> __thiscall Character::GetQuest(Character *this,short id)

{
  iterator iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined6 in_register_00000032;
  shared_ptr<Quest_Context> sVar3;
  key_type local_12;
  
  iVar1 = std::
          _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest_Context>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
          ::find((_Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest_Context>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                  *)(CONCAT62(in_register_00000032,id) + 0x390),&local_12);
  if (iVar1._M_node == (_Base_ptr)(CONCAT62(in_register_00000032,id) + 0x398)) {
    (this->super_Command_Source)._vptr_Command_Source = (_func_int **)0x0;
    this->login_time = 0;
    this->online = false;
    this->nowhere = false;
    *(undefined2 *)&this->field_0xe = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2> *)
               &iVar1._M_node[1]._M_parent);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Quest_Context>)
         sVar3.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Quest_Context> Character::GetQuest(short id)
{
	auto it = this->quests.find(id);

	if (it == this->quests.end())
		return std::shared_ptr<Quest_Context>();

	return it->second;
}